

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::ArrayJoinPromiseNodeBase::ArrayJoinPromiseNodeBase
          (ArrayJoinPromiseNodeBase *this,Array<kj::Own<kj::_::PromiseNode>_> *promises,
          ExceptionOrValue *resultParts,size_t partSize)

{
  bool bVar1;
  size_t sVar2;
  unsigned_long *puVar3;
  Own<kj::_::PromiseNode> *pOVar4;
  Range<unsigned_long> RVar5;
  Array<kj::_::ArrayJoinPromiseNodeBase::Branch> local_a8;
  bool *local_90;
  ExceptionOrValue *output;
  Iterator IStack_80;
  uint i;
  Iterator __end2;
  Iterator __begin2;
  Range<unsigned_long> *__range2;
  undefined1 local_48 [8];
  ArrayBuilder<kj::_::ArrayJoinPromiseNodeBase::Branch> builder;
  size_t partSize_local;
  ExceptionOrValue *resultParts_local;
  Array<kj::Own<kj::_::PromiseNode>_> *promises_local;
  ArrayJoinPromiseNodeBase *this_local;
  
  builder.disposer = (ArrayDisposer *)partSize;
  PromiseNode::PromiseNode(&this->super_PromiseNode);
  (this->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_007d8900;
  sVar2 = Array<kj::Own<kj::_::PromiseNode>_>::size(promises);
  this->countLeft = (uint)sVar2;
  PromiseNode::OnReadyEvent::OnReadyEvent(&this->onReadyEvent);
  Array<kj::_::ArrayJoinPromiseNodeBase::Branch>::Array(&this->branches);
  sVar2 = Array<kj::Own<kj::_::PromiseNode>_>::size(promises);
  heapArrayBuilder<kj::_::ArrayJoinPromiseNodeBase::Branch>
            ((ArrayBuilder<kj::_::ArrayJoinPromiseNodeBase::Branch> *)local_48,sVar2);
  RVar5 = indices<kj::Array<kj::Own<kj::_::PromiseNode>>&>(promises);
  __begin2.value = RVar5.begin_;
  __end2 = Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin2);
  IStack_80 = Range<unsigned_long>::end((Range<unsigned_long> *)&__begin2);
  while( true ) {
    bVar1 = Range<unsigned_long>::Iterator::operator!=(&__end2,&stack0xffffffffffffff80);
    if (!bVar1) break;
    puVar3 = Range<unsigned_long>::Iterator::operator*(&__end2);
    output._4_4_ = (uint)*puVar3;
    local_90 = &(resultParts->exception).ptr.isSet + (ulong)output._4_4_ * (long)builder.disposer;
    pOVar4 = Array<kj::Own<kj::_::PromiseNode>_>::operator[](promises,(ulong)output._4_4_);
    pOVar4 = mv<kj::Own<kj::_::PromiseNode>>(pOVar4);
    ArrayBuilder<kj::_::ArrayJoinPromiseNodeBase::Branch>::
    add<kj::_::ArrayJoinPromiseNodeBase&,kj::Own<kj::_::PromiseNode>,kj::_::ExceptionOrValue&>
              ((ArrayBuilder<kj::_::ArrayJoinPromiseNodeBase::Branch> *)local_48,this,pOVar4,
               (ExceptionOrValue *)local_90);
    Range<unsigned_long>::Iterator::operator++(&__end2);
  }
  ArrayBuilder<kj::_::ArrayJoinPromiseNodeBase::Branch>::finish
            (&local_a8,(ArrayBuilder<kj::_::ArrayJoinPromiseNodeBase::Branch> *)local_48);
  Array<kj::_::ArrayJoinPromiseNodeBase::Branch>::operator=(&this->branches,&local_a8);
  Array<kj::_::ArrayJoinPromiseNodeBase::Branch>::~Array(&local_a8);
  sVar2 = Array<kj::_::ArrayJoinPromiseNodeBase::Branch>::size(&this->branches);
  if (sVar2 == 0) {
    PromiseNode::OnReadyEvent::arm(&this->onReadyEvent);
  }
  ArrayBuilder<kj::_::ArrayJoinPromiseNodeBase::Branch>::~ArrayBuilder
            ((ArrayBuilder<kj::_::ArrayJoinPromiseNodeBase::Branch> *)local_48);
  return;
}

Assistant:

ArrayJoinPromiseNodeBase::ArrayJoinPromiseNodeBase(
    Array<Own<PromiseNode>> promises, ExceptionOrValue* resultParts, size_t partSize)
    : countLeft(promises.size()) {
  // Make the branches.
  auto builder = heapArrayBuilder<Branch>(promises.size());
  for (uint i: indices(promises)) {
    ExceptionOrValue& output = *reinterpret_cast<ExceptionOrValue*>(
        reinterpret_cast<byte*>(resultParts) + i * partSize);
    builder.add(*this, kj::mv(promises[i]), output);
  }
  branches = builder.finish();

  if (branches.size() == 0) {
    onReadyEvent.arm();
  }
}